

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlChar * xmlBufferDetach(xmlBufferPtr buf)

{
  xmlChar *ret;
  xmlBufferPtr buf_local;
  
  if (buf == (xmlBufferPtr)0x0) {
    buf_local = (xmlBufferPtr)0x0;
  }
  else if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
    buf_local = (xmlBufferPtr)0x0;
  }
  else {
    buf_local = (xmlBufferPtr)buf->content;
    buf->content = (xmlChar *)0x0;
    buf->size = 0;
    buf->use = 0;
  }
  return (xmlChar *)buf_local;
}

Assistant:

xmlChar *
xmlBufferDetach(xmlBufferPtr buf) {
    xmlChar *ret;

    if (buf == NULL)
        return(NULL);
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE)
        return(NULL);

    ret = buf->content;
    buf->content = NULL;
    buf->size = 0;
    buf->use = 0;

    return ret;
}